

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O0

void test_small_alloc_info(void)

{
  float local_c [2];
  float actual_alloc_factor;
  
  plan(1);
  _space(_stdout);
  printf("# *** %s ***\n","test_small_alloc_info");
  small_alloc_create(&alloc,&cache,0x40,0x40,1.5,local_c);
  check_small_alloc_info(&alloc,0x101,false,0x200);
  check_small_alloc_info(&alloc,0x200,false,0x200);
  check_small_alloc_info(&alloc,0x4001,false,0x40000);
  check_small_alloc_info(&alloc,0x40000,false,0x40000);
  check_small_alloc_info(&alloc,0x40001,true,0x40001);
  _ok(1,"true",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",0xb5,
      "line %d");
  small_alloc_destroy(&alloc);
  _space(_stdout);
  printf("# *** %s: done ***\n","test_small_alloc_info");
  check_plan();
  return;
}

Assistant:

static void
test_small_alloc_info(void)
{
	plan(1);
	header();
	/*
	 * Create the following groups of mempools.
	 * The table is valid for SLAB_MIN_ORDER0_SIZE = [4096, 8192, 16384].
	 * For 32768 and 65536 the first groups are merged.
	 *
	 *  slab  |  mempool
	 *  size  |  objsize
	 * -------|----------------------------------------------------------
	 *  16 KB | 64, 128
	 *  32 KB | 192, 256
	 *  64 KB | 384, 512
	 * 128 KB | 768, 1024
	 * 256 KB | 1536, 2048
	 * 512 KB | 3072, 4096
	 *   1 MB | 6144, 8192
	 *   2 MB | 12288, 16384
	 *   4 MB | 24576, 32768, 49152, 65536, 98304, 131072, 196608, 262144
	 */
	float actual_alloc_factor;
	small_alloc_create(&alloc, &cache, 64, 64, 1.5f, &actual_alloc_factor);

	check_small_alloc_info(&alloc, 257, false, 512);
	check_small_alloc_info(&alloc, 512, false, 512);
	check_small_alloc_info(&alloc, 16385, false, 262144);
	check_small_alloc_info(&alloc, 262144, false, 262144);
	check_small_alloc_info(&alloc, 262145, true, 262145);
	ok(true);

	small_alloc_destroy(&alloc);
	footer();
	check_plan();
}